

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse.c
# Opt level: O0

void insert_PNode_internal(Parser *p,PNode *pn)

{
  uint uVar1;
  PNode **__ptr;
  PNode *pn_00;
  uint uVar2;
  PNodeHash *pPVar3;
  PNode **ppPVar4;
  uint m;
  PNode **v;
  PNode *t;
  uint i;
  uint h;
  PNodeHash *ph;
  PNode *pn_local;
  Parser *p_local;
  
  pPVar3 = &p->pnode_hash;
  uVar2 = (int)((long)(pn->parse_node).start_loc.s << 8) +
          (int)((long)(pn->parse_node).end_skip << 0x10) + (pn->parse_node).symbol +
          (int)pn->initial_scope;
  if ((p->pnode_hash).m < (p->pnode_hash).n + 1) {
    __ptr = pPVar3->v;
    uVar1 = (p->pnode_hash).m;
    (p->pnode_hash).i = (p->pnode_hash).i + 1;
    (p->pnode_hash).m = d_prime2[(p->pnode_hash).i];
    ppPVar4 = (PNode **)malloc((ulong)(p->pnode_hash).m << 3);
    pPVar3->v = ppPVar4;
    memset(pPVar3->v,0,(ulong)(p->pnode_hash).m << 3);
    for (t._0_4_ = 0; (uint)t < uVar1; t._0_4_ = (uint)t + 1) {
      while (pn_00 = __ptr[(uint)t], pn_00 != (PNode *)0x0) {
        __ptr[(uint)t] = __ptr[(uint)t]->bucket_next;
        insert_PNode_internal(p,pn_00);
      }
    }
    free(__ptr);
  }
  pn->bucket_next = pPVar3->v[(ulong)uVar2 % (ulong)(p->pnode_hash).m];
  pPVar3->v[(ulong)uVar2 % (ulong)(p->pnode_hash).m] = pn;
  (p->pnode_hash).n = (p->pnode_hash).n + 1;
  return;
}

Assistant:

void insert_PNode_internal(Parser *p, PNode *pn) {
  PNodeHash *ph = &p->pnode_hash;
  uint h = PNODE_HASH(pn->parse_node.start_loc.s, pn->parse_node.end_skip, pn->parse_node.symbol, pn->initial_scope), i;
  PNode *t;

  if (ph->n + 1 > ph->m) {
    PNode **v = ph->v;
    uint m = ph->m;
    ph->i++;
    ph->m = d_prime2[ph->i];
    ph->v = (PNode **)MALLOC(ph->m * sizeof(*ph->v));
    memset(ph->v, 0, ph->m * sizeof(*ph->v));
    for (i = 0; i < m; i++)
      while ((t = v[i])) {
        v[i] = v[i]->bucket_next;
        insert_PNode_internal(p, t);
      }
    FREE(v);
  }
  pn->bucket_next = ph->v[h % ph->m];
  ph->v[h % ph->m] = pn;
  ph->n++;
}